

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_cursor.c
# Opt level: O3

int pos_form_cursor(FORM *form)

{
  int iVar1;
  int *piVar2;
  
  if (form == (FORM *)0x0) {
    iVar1 = -2;
  }
  else {
    iVar1 = -7;
    if ((form->status & 1) != 0) {
      iVar1 = _nc_Position_Form_Cursor(form);
    }
  }
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int pos_form_cursor(FORM * form)
{
  int res;

  if (!form)
   res = E_BAD_ARGUMENT;
  else
    {
      if (!(form->status & _POSTED))
        res = E_NOT_POSTED;
      else
	res = _nc_Position_Form_Cursor(form);
    }
  RETURN(res);
}